

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

bool __thiscall
Highs::hasRepeatedLinearObjectivePriorities(Highs *this,HighsLinearObjective *linear_objective)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  long in_RSI;
  long in_RDI;
  HighsInt priority1;
  HighsInt iObj1;
  HighsInt priority0;
  HighsInt iObj0;
  HighsInt num_linear_objective;
  int local_28;
  int local_20;
  
  sVar3 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::size
                    ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                     (in_RDI + 0x520));
  iVar2 = (int)sVar3;
  if ((0 < iVar2) && ((1 < iVar2 || (in_RSI != 0)))) {
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      pvVar4 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::operator[]
                         ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                          (in_RDI + 0x520),(long)local_20);
      iVar1 = pvVar4->priority;
      local_28 = local_20;
      while (local_28 = local_28 + 1, local_28 < iVar2) {
        pvVar4 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::
                 operator[]((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                            (in_RDI + 0x520),(long)local_28);
        if (pvVar4->priority == iVar1) {
          return true;
        }
      }
      if ((in_RSI != 0) && (*(int *)(in_RSI + 0x38) == iVar1)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Highs::hasRepeatedLinearObjectivePriorities(
    const HighsLinearObjective* linear_objective) const {
  // Look for repeated values in the linear objective priorities, also
  // comparing linear_objective if it's not a null pointer. Cost is
  // O(n^2), but who will have more than O(1) linear objectives!
  HighsInt num_linear_objective = this->multi_linear_objective_.size();
  if (num_linear_objective <= 0 ||
      (num_linear_objective <= 1 && !linear_objective))
    return false;
  for (HighsInt iObj0 = 0; iObj0 < num_linear_objective; iObj0++) {
    HighsInt priority0 = this->multi_linear_objective_[iObj0].priority;
    for (HighsInt iObj1 = iObj0 + 1; iObj1 < num_linear_objective; iObj1++) {
      HighsInt priority1 = this->multi_linear_objective_[iObj1].priority;
      if (priority1 == priority0) return true;
    }
    if (linear_objective) {
      if (linear_objective->priority == priority0) return true;
    }
  }
  return false;
}